

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestCase
               (ostream *stream,TestCase *test_case)

{
  char *test_case_name;
  ostream *poVar1;
  TestInfo *pTVar2;
  TimeInMillis ms;
  TestResult *result;
  int i;
  int i_00;
  string kTestsuite;
  allocator local_85;
  int local_84;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"testsuite",(allocator *)&local_80);
  poVar1 = std::operator<<(stream,"  <");
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::string((string *)&local_80,"name",(allocator *)&local_84);
  std::__cxx11::string::string((string *)&local_60,(test_case->name_)._M_dataplus._M_p,&local_85);
  OutputXmlAttribute(stream,&local_40,&local_80,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"tests",&local_85);
  local_84 = TestCase::reportable_test_count(test_case);
  StreamableToString<int>(&local_60,&local_84);
  OutputXmlAttribute(stream,&local_40,&local_80,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  if (FLAGS_gtest_list_tests == '\0') {
    std::__cxx11::string::string((string *)&local_80,"failures",&local_85);
    local_84 = TestCase::failed_test_count(test_case);
    StreamableToString<int>(&local_60,&local_84);
    OutputXmlAttribute(stream,&local_40,&local_80,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string((string *)&local_80,"disabled",&local_85);
    local_84 = TestCase::reportable_disabled_test_count(test_case);
    StreamableToString<int>(&local_60,&local_84);
    OutputXmlAttribute(stream,&local_40,&local_80,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string((string *)&local_80,"errors",(allocator *)&local_84);
    std::__cxx11::string::string((string *)&local_60,"0",&local_85);
    OutputXmlAttribute(stream,&local_40,&local_80,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string((string *)&local_80,"time",(allocator *)&local_84);
    FormatTimeInMillisAsSeconds_abi_cxx11_(&local_60,(internal *)test_case->elapsed_time_,ms);
    OutputXmlAttribute(stream,&local_40,&local_80,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    TestPropertiesAsXmlAttributes_abi_cxx11_
              (&local_80,(XmlUnitTestResultPrinter *)&test_case->ad_hoc_test_result_,result);
    std::operator<<(stream,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::operator<<(stream,">\n");
  for (i_00 = 0;
      i_00 < (int)((ulong)((long)(test_case->test_info_list_).
                                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(test_case->test_info_list_).
                                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3); i_00 = i_00 + 1) {
    pTVar2 = TestCase::GetTestInfo(test_case,i_00);
    if ((pTVar2->matches_filter_ == true) && ((pTVar2->is_in_another_shard_ & 1U) == 0)) {
      test_case_name = (test_case->name_)._M_dataplus._M_p;
      pTVar2 = TestCase::GetTestInfo(test_case,i_00);
      OutputXmlTestInfo(stream,test_case_name,pTVar2);
    }
  }
  poVar1 = std::operator<<(stream,"  </");
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestCase(std::ostream* stream,
                                                const TestCase& test_case) {
  const std::string kTestsuite = "testsuite";
  *stream << "  <" << kTestsuite;
  OutputXmlAttribute(stream, kTestsuite, "name", test_case.name());
  OutputXmlAttribute(stream, kTestsuite, "tests",
                     StreamableToString(test_case.reportable_test_count()));
  if (!GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "failures",
                       StreamableToString(test_case.failed_test_count()));
    OutputXmlAttribute(
        stream, kTestsuite, "disabled",
        StreamableToString(test_case.reportable_disabled_test_count()));
    OutputXmlAttribute(stream, kTestsuite, "errors", "0");
    OutputXmlAttribute(stream, kTestsuite, "time",
                       FormatTimeInMillisAsSeconds(test_case.elapsed_time()));
    *stream << TestPropertiesAsXmlAttributes(test_case.ad_hoc_test_result());
  }
  *stream << ">\n";
  for (int i = 0; i < test_case.total_test_count(); ++i) {
    if (test_case.GetTestInfo(i)->is_reportable())
      OutputXmlTestInfo(stream, test_case.name(), *test_case.GetTestInfo(i));
  }
  *stream << "  </" << kTestsuite << ">\n";
}